

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall Engine_testSetDoubleWithTags_Test::TestBody(Engine_testSetDoubleWithTags_Test *this)

{
  bool bVar1;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *this_00;
  pointer pHVar2;
  char *pcVar3;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  value_type im;
  AssertionResult gtest_ar;
  TestHandler *th;
  value_type *h;
  Engine e;
  undefined7 in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc47;
  unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  undefined1 uVar4;
  Measure<double> *in_stack_fffffffffffffc58;
  int line;
  undefined7 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc67;
  undefined1 uVar5;
  undefined8 in_stack_fffffffffffffc68;
  Type type;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  undefined1 uVar6;
  undefined7 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc87;
  char *in_stack_fffffffffffffc88;
  undefined7 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc97;
  Message *in_stack_fffffffffffffcb8;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  undefined1 uVar7;
  long local_328;
  AssertionResult local_2e8 [2];
  AssertionResult local_2c8 [2];
  AssertionResult local_2a8;
  Tag *in_stack_fffffffffffffd70;
  Tag *in_stack_fffffffffffffd78;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd88;
  Engine *in_stack_fffffffffffffd90;
  AssertionResult local_258 [2];
  undefined8 local_238;
  AssertionResult local_230 [2];
  undefined4 local_20c;
  AssertionResult local_208 [2];
  undefined4 local_1e4;
  AssertionResult local_1e0 [2];
  AssertionResult local_1c0 [5];
  vector<Tag,_std::allocator<Tag>_> local_170;
  uint local_154;
  size_type local_140;
  undefined4 local_134;
  AssertionResult local_130;
  long local_120;
  const_reference local_118;
  undefined8 local_90;
  allocator local_81;
  string local_80 [64];
  Engine local_40;
  
  type = (Type)((ulong)in_stack_fffffffffffffc68 >> 0x20);
  std::make_unique<TestHandler>();
  std::unique_ptr<Handler,std::default_delete<Handler>>::
  unique_ptr<TestHandler,std::default_delete<TestHandler>,void>
            ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
             CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),in_stack_fffffffffffffc48
            );
  Engine::Engine((Engine *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                 in_stack_fffffffffffffc88,
                 (unique_ptr<Handler,_std::default_delete<Handler>_> *)
                 CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
  std::unique_ptr<Handler,_std::default_delete<Handler>_>::~unique_ptr
            ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
             CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
  std::unique_ptr<TestHandler,_std::default_delete<TestHandler>_>::~unique_ptr
            ((unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *)
             CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"gauge.value",&local_81);
  local_90 = 0x405900083126e979;
  Tag::Tag((Tag *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
           in_stack_fffffffffffffc88,
           (char *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
  Tag::Tag((Tag *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
           in_stack_fffffffffffffc88,
           (char *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
  Engine::Set<double,_nullptr,_Tag,_Tag>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             (double *)in_stack_fffffffffffffd80.ptr_,in_stack_fffffffffffffd78,
             in_stack_fffffffffffffd70);
  Tag::~Tag((Tag *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
  Tag::~Tag((Tag *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  this_00 = Engine::GetHandlers(&local_40);
  local_118 = std::
              vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
              ::operator[](this_00,0);
  pHVar2 = std::unique_ptr<Handler,_std::default_delete<Handler>_>::get
                     ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
                      CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
  if (pHVar2 == (pointer)0x0) {
    local_328 = 0;
  }
  else {
    local_328 = __dynamic_cast(pHVar2,&Handler::typeinfo,&TestHandler::typeinfo,0);
  }
  local_120 = local_328;
  local_134 = 1;
  local_140 = std::vector<Measure<double>,_std::allocator<Measure<double>_>_>::size
                        ((vector<Measure<double>,_std::allocator<Measure<double>_>_> *)
                         (local_328 + 0x20));
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)in_stack_fffffffffffffc58,
             (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
             (int *)in_stack_fffffffffffffc48,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    testing::AssertionResult::failure_message((AssertionResult *)0x124d7b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),type,
               (char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
               (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),
               in_stack_fffffffffffffcb8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
    testing::Message::~Message((Message *)0x124dde);
  }
  local_154 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x124e4c);
  if (local_154 == 0) {
    std::vector<Measure<double>,_std::allocator<Measure<double>_>_>::operator[]
              ((vector<Measure<double>,_std::allocator<Measure<double>_>_> *)(local_120 + 0x20),0);
    Measure<double>::Measure
              ((Measure<double> *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
               in_stack_fffffffffffffc58);
    testing::internal::EqHelper<false>::Compare<char[17],std::__cxx11::string>
              ((char *)in_stack_fffffffffffffc58,
               (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               (char (*) [17])in_stack_fffffffffffffc48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c0);
    uVar7 = bVar1;
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
      in_stack_fffffffffffffcb8 =
           (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x124f38);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),type,
                 (char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                 (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(uVar7,in_stack_fffffffffffffcc0),in_stack_fffffffffffffcb8
                );
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
      testing::Message::~Message((Message *)0x124f9b);
    }
    local_154 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x125009);
    if (local_154 == 0) {
      local_1e4 = 1;
      testing::internal::EqHelper<false>::Compare<MetricTypes::MetricType,MetricTypes::MetricType>
                ((char *)in_stack_fffffffffffffc58,
                 (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                 (MetricType *)in_stack_fffffffffffffc48,
                 (MetricType *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1e0);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
        testing::AssertionResult::failure_message((AssertionResult *)0x1250bb);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                   type,(char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                   (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(uVar7,in_stack_fffffffffffffcc0),
                   in_stack_fffffffffffffcb8);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
        testing::Message::~Message((Message *)0x125118);
      }
      local_154 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x125186);
      if (local_154 == 0) {
        local_20c = 1;
        testing::internal::EqHelper<false>::Compare<int,float>
                  ((char *)in_stack_fffffffffffffc58,
                   (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                   (int *)in_stack_fffffffffffffc48,
                   (float *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_208);
        if (!bVar1) {
          testing::Message::Message
                    ((Message *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
          testing::AssertionResult::failure_message((AssertionResult *)0x125238);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                     type,(char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                     (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                     (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT17(uVar7,in_stack_fffffffffffffcc0),
                     in_stack_fffffffffffffcb8);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
          testing::Message::~Message((Message *)0x125295);
        }
        local_154 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x125303);
        if (local_154 == 0) {
          local_238 = 0x405900083126e979;
          testing::internal::EqHelper<false>::Compare<double,double>
                    ((char *)in_stack_fffffffffffffc58,
                     (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                     (double *)in_stack_fffffffffffffc48,
                     (double *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_230);
          if (!bVar1) {
            testing::Message::Message
                      ((Message *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
            testing::AssertionResult::failure_message((AssertionResult *)0x1253bc);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70)
                       ,type,(char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                       (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                       (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT17(uVar7,in_stack_fffffffffffffcc0),
                       in_stack_fffffffffffffcb8);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40)
                      );
            testing::Message::~Message((Message *)0x125419);
          }
          local_154 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x125487);
          if (local_154 == 0) {
            std::vector<Tag,_std::allocator<Tag>_>::size(&local_170);
            testing::internal::EqHelper<false>::Compare<int,unsigned_long>
                      ((char *)in_stack_fffffffffffffc58,
                       (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                       (int *)in_stack_fffffffffffffc48,
                       (unsigned_long *)
                       CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_258);
            if (!bVar1) {
              testing::Message::Message
                        ((Message *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
              testing::AssertionResult::failure_message((AssertionResult *)0x12554e);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)
                         CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),type,
                         (char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                         (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                         (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)CONCAT17(uVar7,in_stack_fffffffffffffcc0),
                         in_stack_fffffffffffffcb8);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)
                         CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
              testing::Message::~Message((Message *)0x1255ab);
            }
            local_154 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x125619);
            if (local_154 == 0) {
              std::vector<Tag,_std::allocator<Tag>_>::operator[](&local_170,0);
              testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
                        ((char *)in_stack_fffffffffffffc58,
                         (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                         (char (*) [4])in_stack_fffffffffffffc48,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                ((AssertionResult *)&stack0xfffffffffffffd78);
              uVar6 = bVar1;
              if (!bVar1) {
                testing::Message::Message((Message *)CONCAT17(bVar1,in_stack_fffffffffffffc70));
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1256cb);
                type = (Type)((ulong)pcVar3 >> 0x20);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc70),type,
                           (char *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                           (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                           (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)CONCAT17(uVar7,in_stack_fffffffffffffcc0),
                           in_stack_fffffffffffffcb8);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)
                           CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
                testing::Message::~Message((Message *)0x125728);
              }
              local_154 = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x125796);
              if (local_154 == 0) {
                std::vector<Tag,_std::allocator<Tag>_>::operator[](&local_170,0);
                testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
                          ((char *)in_stack_fffffffffffffc58,
                           (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                           (char (*) [4])in_stack_fffffffffffffc48,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
                bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a8);
                uVar5 = bVar1;
                if (!bVar1) {
                  testing::Message::Message((Message *)CONCAT17(uVar6,in_stack_fffffffffffffc70));
                  in_stack_fffffffffffffc58 =
                       (Measure<double> *)
                       testing::AssertionResult::failure_message((AssertionResult *)0x12584c);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc70),type,
                             (char *)CONCAT17(uVar5,in_stack_fffffffffffffc60),
                             (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                             (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)CONCAT17(uVar7,in_stack_fffffffffffffcc0),
                             in_stack_fffffffffffffcb8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)
                             CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
                  testing::Message::~Message((Message *)0x1258a9);
                }
                local_154 = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x125917);
                if (local_154 == 0) {
                  std::vector<Tag,_std::allocator<Tag>_>::operator[](&local_170,1);
                  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
                            ((char *)in_stack_fffffffffffffc58,
                             (char *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                             (char (*) [6])in_stack_fffffffffffffc48,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2c8);
                  uVar4 = bVar1;
                  if (!bVar1) {
                    testing::Message::Message((Message *)CONCAT17(uVar6,in_stack_fffffffffffffc70));
                    in_stack_fffffffffffffc48 =
                         (unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *)
                         testing::AssertionResult::failure_message((AssertionResult *)0x1259ca);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc70),type,
                               (char *)CONCAT17(uVar5,in_stack_fffffffffffffc60),
                               (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                               (char *)CONCAT17(uVar4,in_stack_fffffffffffffc50));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)CONCAT17(uVar7,in_stack_fffffffffffffcc0),
                               in_stack_fffffffffffffcb8);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)
                               CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
                    testing::Message::~Message((Message *)0x125a27);
                  }
                  local_154 = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x125a95);
                  if (local_154 == 0) {
                    std::vector<Tag,_std::allocator<Tag>_>::operator[](&local_170,1);
                    testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
                              ((char *)in_stack_fffffffffffffc58,
                               (char *)CONCAT17(uVar4,in_stack_fffffffffffffc50),
                               (char (*) [6])in_stack_fffffffffffffc48,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
                    line = (int)((ulong)in_stack_fffffffffffffc58 >> 0x20);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2e8);
                    in_stack_fffffffffffffc47 = bVar1;
                    if (!bVar1) {
                      testing::Message::Message
                                ((Message *)CONCAT17(uVar6,in_stack_fffffffffffffc70));
                      testing::AssertionResult::failure_message((AssertionResult *)0x125b4c);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc70),type,
                                 (char *)CONCAT17(uVar5,in_stack_fffffffffffffc60),line,
                                 (char *)CONCAT17(uVar4,in_stack_fffffffffffffc50));
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)CONCAT17(uVar7,in_stack_fffffffffffffcc0),
                                 in_stack_fffffffffffffcb8);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)
                                 CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
                      testing::Message::~Message((Message *)0x125ba7);
                    }
                    local_154 = (uint)!bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)0x125c12);
                    if (local_154 == 0) {
                      local_154 = 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    Measure<double>::~Measure
              ((Measure<double> *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
  }
  Engine::~Engine((Engine *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
  return;
}

Assistant:

TEST(Engine, testSetDoubleWithTags) {
    Engine e("test", std::move(std::make_unique<TestHandler>()));
    e.Set("gauge.value", 100.0005, Tag("Foo", "Bar"), Tag("Hello", "World"));
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->doubleMeasures.size());
    auto im = th->doubleMeasures[0];
    ASSERT_EQ("test.gauge.value", im.name);
    ASSERT_EQ(MetricType::Gauge, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(100.0005, im.value);
    ASSERT_EQ(2, im.tags.size());
    ASSERT_EQ("Foo", im.tags[0].name);
    ASSERT_EQ("Bar", im.tags[0].value);
    ASSERT_EQ("Hello", im.tags[1].name);
    ASSERT_EQ("World", im.tags[1].value);
}